

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
int_writer<char,_fmt::v5::basic_format_specs<char>_>::on_bin
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this)

{
  int_writer<char,fmt::v5::basic_format_specs<char>> iVar1;
  uint uVar2;
  bool bVar3;
  int_writer<char,fmt::v5::basic_format_specs<char>> *in_RDI;
  basic_format_specs<char> *in_stack_00000028;
  int in_stack_00000034;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_00000038;
  int num_digits;
  undefined1 in_stack_00000048 [16];
  
  bVar3 = core_format_specs::has((core_format_specs *)(*(long *)(in_RDI + 8) + 0xc),8);
  if (bVar3) {
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x14] = (int_writer<char,fmt::v5::basic_format_specs<char>>)0x30;
    iVar1 = *(int_writer<char,fmt::v5::basic_format_specs<char>> *)(*(long *)(in_RDI + 8) + 0x11);
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x14] = iVar1;
  }
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
  int_writer<char,fmt::v5::basic_format_specs<char>>::count_digits<1u>(in_RDI);
  get_prefix((int_writer<char,_fmt::v5::basic_format_specs<char>_> *)0x297042);
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
            (in_stack_00000038,in_stack_00000034,(string_view)in_stack_00000048,in_stack_00000028,
             (bin_writer<1>)this);
  return;
}

Assistant:

void on_bin() {
      if (spec.has(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type);
      }
      int num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }